

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void __thiscall el::base::LogDispatcher::dispatch(LogDispatcher *this)

{
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_node_base *p_Var2;
  LogDispatchData data;
  LogMessage *local_70;
  DispatchAction local_68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
  local_60;
  
  if ((this->m_proceed == true) && (this->m_dispatchAction == None)) {
    this->m_proceed = false;
  }
  else if (this->m_proceed != false) {
    (**(code **)(*elStorage + 0x10))();
    if ((*(byte *)(elStorage + 4) & 0x20) != 0) {
      TypedConfigurations::validateFileRolling
                (((this->m_logMessage).m_logger)->m_typedConfigurations,(this->m_logMessage).m_level
                 ,(PreRollOutCallback *)(elStorage + 0x12));
    }
    local_70 = (LogMessage *)0x0;
    local_68 = None;
    p_Var2 = (_Rb_tree_node_base *)(elStorage + 0x17);
    for (p_Var1 = (_Rb_tree_node_base *)elStorage[0x19]; p_Var1 != p_Var2;
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      utils::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
      ::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>,_true>
                (&local_60,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
                  *)(p_Var1 + 1));
      if ((local_60.second.super___shared_ptr<el::LogDispatchCallback,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr != (element_type *)0x0) &&
         (((local_60.second.super___shared_ptr<el::LogDispatchCallback,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->super_Callback<el::LogDispatchData>).super_ThreadSafe.field_0x9 == '\x01')) {
        local_68 = this->m_dispatchAction;
        local_70 = &this->m_logMessage;
        (*((local_60.second.super___shared_ptr<el::LogDispatchCallback,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->super_Callback<el::LogDispatchData>).super_ThreadSafe._vptr_ThreadSafe[5])
                  (local_60.second.
                   super___shared_ptr<el::LogDispatchCallback,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   &local_70);
      }
      utils::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
      ::~pair(&local_60);
    }
  }
  return;
}

Assistant:

void LogDispatcher::dispatch(void) {
  if (m_proceed && m_dispatchAction == base::DispatchAction::None) {
    m_proceed = false;
  }
  if (!m_proceed) {
    return;
  }
  base::threading::ScopedLock scopedLock(ELPP->lock());
  base::TypedConfigurations* tc = m_logMessage.logger()->m_typedConfigurations;
  if (ELPP->hasFlag(LoggingFlag::StrictLogFileSizeCheck)) {
    tc->validateFileRolling(m_logMessage.level(), ELPP->preRollOutCallback());
  }
  LogDispatchCallback* callback = nullptr;
  LogDispatchData data;
  for (const std::pair<std::string, base::type::LogDispatchCallbackPtr>& h
       : ELPP->m_logDispatchCallbacks) {
    callback = h.second.get();
    if (callback != nullptr && callback->enabled()) {
      data.setLogMessage(&m_logMessage);
      data.setDispatchAction(m_dispatchAction);
      callback->handle(&data);
    }
  }
}